

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  long in_FS_OFFSET;
  allocator local_59;
  ScopedElement e;
  string local_48;
  undefined8 local_28;
  
  local_28 = *(size_type *)(in_FS_OFFSET + 0x28);
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    std::__cxx11::string::string((string *)&local_48,"OverallResults",&local_59);
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)&this->m_xml,(XmlFormatting)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)&local_48,"successes",&local_59);
    XmlWriter::writeAttribute<unsigned_long>
              (e.m_writer,&local_48,&(sectionStats->assertions).passed);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)&local_48,"failures",&local_59);
    XmlWriter::writeAttribute<unsigned_long>
              (e.m_writer,&local_48,&(sectionStats->assertions).failed);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)&local_48,"expectedFailures",&local_59);
    XmlWriter::writeAttribute<unsigned_long>
              (e.m_writer,&local_48,&(sectionStats->assertions).failedButOk);
    std::__cxx11::string::~string((string *)&local_48);
    iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      std::__cxx11::string::string((string *)&local_48,"durationInSeconds",&local_59);
      XmlWriter::writeAttribute<double>(e.m_writer,&local_48,&sectionStats->durationInSeconds);
      std::__cxx11::string::~string((string *)&local_48);
    }
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
    XmlWriter::ScopedElement::~ScopedElement(&e);
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if( --m_sectionDepth > 0 ) {
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
            e.writeAttribute( "successes", sectionStats.assertions.passed );
            e.writeAttribute( "failures", sectionStats.assertions.failed );
            e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

            m_xml.endElement();
        }
    }